

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_fxtype_params.cpp
# Opt level: O2

void __thiscall sc_dt::sc_fxtype_params::dump(sc_fxtype_params *this,ostream *os)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"sc_fxtype_params");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"(");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"wl     = ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->m_wl);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"iwl    = ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->m_iwl);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"q_mode = ");
  poVar1 = sc_dt::operator<<(poVar1,this->m_q_mode);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"o_mode = ");
  poVar1 = sc_dt::operator<<(poVar1,this->m_o_mode);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"n_bits = ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->m_n_bits);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
sc_fxtype_params::dump( ::std::ostream& os ) const
{
    os << "sc_fxtype_params" << ::std::endl;
    os << "(" << ::std::endl;
    os << "wl     = " << m_wl << ::std::endl;
    os << "iwl    = " << m_iwl << ::std::endl;
    os << "q_mode = " << m_q_mode << ::std::endl;
    os << "o_mode = " << m_o_mode << ::std::endl;
    os << "n_bits = " << m_n_bits << ::std::endl;
    os << ")" << ::std::endl;
}